

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiple_undo.cpp
# Opt level: O2

bool handler_selective_repeat_same_allowed_proc(Am_Object *command_obj)

{
  Am_Selective_Allowed_Method_Type *pAVar1;
  bool bVar2;
  bool bVar3;
  Am_Value *pAVar4;
  undefined1 local_70 [8];
  Am_Value value;
  Am_Object_Method method;
  Am_Selective_Allowed_Method allowed_method;
  
  value.type = 0;
  allowed_method.from_wrapper = (Am_Method_Wrapper *)0x0;
  allowed_method.Call = (Am_Selective_Allowed_Method_Type *)0x0;
  value.value.wrapper_value = (Am_Wrapper *)0x0;
  while( true ) {
    bVar2 = Am_Object::Valid(command_obj);
    if (!bVar2) break;
    pAVar4 = Am_Object::Get(command_obj,0x14c,4);
    Am_Selective_Allowed_Method::operator=(&allowed_method,pAVar4);
    pAVar1 = allowed_method.Call;
    if (allowed_method.Call != (Am_Selective_Allowed_Method_Type *)0x0) {
      Am_Object::Am_Object((Am_Object *)local_70,command_obj);
      bVar2 = (*pAVar1)((Am_Object_Data *)local_70);
      Am_Object::~Am_Object((Am_Object *)local_70);
      if (!bVar2) break;
    }
    method.from_wrapper = (Am_Method_Wrapper *)0x0;
    method.Call = (Am_Object_Method_Type *)0x0;
    pAVar4 = Am_Object::Get(command_obj,0x149,4);
    Am_Object_Method::operator=(&method,pAVar4);
    bVar2 = method.Call != (Am_Object_Method_Type *)0x0;
    if (bVar2) goto LAB_001cb2d0;
    pAVar4 = Am_Object::Get(command_obj,0x167,5);
    Am_Value::operator=(&value,pAVar4);
    bVar3 = Am_Value::Valid(&value);
    if (!bVar3 || value.type != 0xa001) goto LAB_001cb2d0;
    Am_Object::operator=(command_obj,&value);
  }
  bVar2 = false;
LAB_001cb2d0:
  Am_Value::~Am_Value(&value);
  return bVar2;
}

Assistant:

Am_Define_Method(Am_Selective_Allowed_Method, bool,
                 handler_selective_repeat_same_allowed, (Am_Object command_obj))
{
  Am_Selective_Allowed_Method allowed_method;
  Am_Value value;
  while (true) {
    if (!command_obj.Valid())
      return false;
    allowed_method =
        command_obj.Get(Am_SELECTIVE_REPEAT_SAME_ALLOWED, Am_NO_DEPENDENCY);
    if (allowed_method.Valid())
      if (!(allowed_method.Call(command_obj)))
        return false;
    Am_Object_Method method;
    method = command_obj.Get(Am_SELECTIVE_REPEAT_SAME_METHOD, Am_NO_DEPENDENCY);
    if (method.Valid())
      return true;

    value = command_obj.Peek(Am_IMPLEMENTATION_CHILD, Am_NO_DEPENDENCY);
    if (value.Valid() && value.type == Am_OBJECT)
      command_obj = value;
    else
      return false;
  }
}